

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextBlockData>::previous(QFragmentMapData<QTextBlockData> *this,uint n)

{
  uint uVar1;
  Header *pHVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  
  pHVar2 = (this->field_0).head;
  if (n == 0) {
    uVar1 = pHVar2->root;
    do {
      uVar4 = uVar1;
      if (uVar4 == 0) {
        return 0;
      }
      uVar1 = *(uint *)((long)pHVar2 + (ulong)uVar4 * 0x48 + 8);
    } while (uVar1 != 0);
  }
  else {
    uVar3 = (ulong)n;
    if (*(int *)((long)pHVar2 + uVar3 * 0x48 + 4) == 0) {
      puVar5 = (uint *)((long)pHVar2 + uVar3 * 0x48);
      do {
        uVar4 = *puVar5;
        if (*(int *)((long)pHVar2 + (ulong)n * 0x48) == 0) {
          return uVar4;
        }
        puVar5 = (uint *)((long)pHVar2 + (ulong)uVar4 * 0x48);
        bVar6 = n == puVar5[1];
        n = uVar4;
      } while (bVar6);
    }
    else {
      puVar5 = (uint *)((long)pHVar2 + uVar3 * 0x48 + 4);
      do {
        uVar4 = *puVar5;
        puVar5 = (uint *)((long)pHVar2 + (ulong)uVar4 * 0x48 + 8);
      } while (*puVar5 != 0);
    }
  }
  return uVar4;
}

Assistant:

uint QFragmentMapData<Fragment>::previous(uint n) const {
    if (!n)
        return maximum(root());

    if (F(n).left) {
        n = F(n).left;
        while (F(n).right)
            n = F(n).right;
    } else {
        uint y = F(n).parent;
        while (F(n).parent && n == F(y).left) {
            n = y;
            y = F(y).parent;
        }
        n = y;
    }
    return n;
}